

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_0::CWriter::WriteV128Decl(CWriter *this)

{
  int iVar1;
  Newline *in_RCX;
  Newline *in_RDX;
  
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[32],wabt::(anonymous_namespace)::Newline,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [32])"#include <simde/wasm/simd128.h>",in_RDX,in_RCX);
  WriteData(this,"#ifndef WASM_RT_SIMD_TYPE_DEFINED",0x21);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  WriteData(this,"#define WASM_RT_SIMD_TYPE_DEFINED",0x21);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  WriteData(this,"typedef simde_v128_t v128;",0x1a);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  WriteData(this,"#endif",6);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    iVar1 = this->consecutive_newline_count_;
    this->consecutive_newline_count_ = iVar1 + 1;
    this->should_write_indent_next_ = true;
    if (iVar1 < 1) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
  }
  this->should_write_indent_next_ = true;
  return;
}

Assistant:

void CWriter::WriteV128Decl() {
  Write("#include <simde/wasm/simd128.h>", Newline(), Newline());
  Write("#ifndef WASM_RT_SIMD_TYPE_DEFINED", Newline(),
        "#define WASM_RT_SIMD_TYPE_DEFINED", Newline(),
        "typedef simde_v128_t v128;", Newline(), "#endif", Newline(),
        Newline());
}